

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O2

int onig_st_lookup_callout_name_table
              (hash_table_type table,OnigEncoding enc,int type,OnigUChar *str_key,OnigUChar *end_key
              ,hash_data_type *value)

{
  int iVar1;
  st_callout_name_key key;
  OnigEncoding local_20;
  int local_18;
  OnigUChar *local_10;
  OnigUChar *local_8;
  
  local_20 = enc;
  local_18 = type;
  local_10 = str_key;
  local_8 = end_key;
  iVar1 = onig_st_lookup((st_table *)table,(st_data_t)&local_20,value);
  return iVar1;
}

Assistant:

extern int
onig_st_lookup_callout_name_table(hash_table_type table,
                                  OnigEncoding enc,
                                  int type,
                                  const UChar* str_key,
                                  const UChar* end_key,
                                  hash_data_type *value)
{
  st_callout_name_key key;

  key.enc  = enc;
  key.type = type;
  key.s    = (UChar* )str_key;
  key.end  = (UChar* )end_key;

  return onig_st_lookup(table, (st_data_t )(&key), value);
}